

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialaddress.cpp
# Opt level: O2

void __thiscall
ElementsConfidentialAddress_EmptyAddressTest_Test::TestBody
          (ElementsConfidentialAddress_EmptyAddressTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  allocator local_539;
  AssertionResult gtest_ar_1;
  ConfidentialKey key;
  ElementsConfidentialAddress local_500;
  Address unblind_addr;
  ElementsConfidentialAddress empty_address;
  
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&empty_address);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress
            (&local_500.unblinded_address_,&empty_address);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_1,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)&local_500 + 0x30));
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&unblind_addr,(ByteData *)&gtest_ar_1);
  pcVar2 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&key,"\"\"",
             "empty_address.GetUnblindedAddress().GetHash().GetHex().c_str()","",
             (char *)unblind_addr._0_8_);
  std::__cxx11::string::~string((string *)&unblind_addr);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_1);
  cfd::core::Address::~Address(&local_500.unblinded_address_);
  if ((char)key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_500);
    if (key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      pcVar2 = *(char **)key.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&unblind_addr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&unblind_addr,(Message *)&local_500);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&unblind_addr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_500);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  cfd::core::ElementsConfidentialAddress::GetConfidentialKey
            ((ConfidentialKey *)&unblind_addr,&empty_address);
  cfd::core::Pubkey::GetHex_abi_cxx11_((string *)&local_500,(Pubkey *)&unblind_addr);
  pcVar2 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,"\"\"","empty_address.GetConfidentialKey().GetHex().c_str()",""
             ,(char *)local_500.unblinded_address_._0_8_);
  std::__cxx11::string::~string((string *)&local_500);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&unblind_addr);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_500);
    if (gtest_ar_1.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&unblind_addr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&unblind_addr,(Message *)&local_500);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&unblind_addr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_500);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::Address::Address(&unblind_addr);
  cfd::core::Pubkey::Pubkey(&key);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&gtest_ar_1,"",&local_539);
    cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
              (&local_500,(string *)&gtest_ar_1);
    cfd::core::ElementsConfidentialAddress::operator=(&empty_address,&local_500);
    cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_500);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
  }
  testing::Message::Message((Message *)&local_500);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
             ,0x2a,
             "Expected: (empty_address = ElementsConfidentialAddress(\"\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_500);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_500);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
              (&local_500,&unblind_addr,&key);
    cfd::core::ElementsConfidentialAddress::operator=(&empty_address,&local_500);
    cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_500);
  }
  testing::Message::Message((Message *)&local_500);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
             ,0x2c,
             "Expected: (empty_address = ElementsConfidentialAddress(unblind_addr, key)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_500);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_500);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  cfd::core::Address::~Address(&unblind_addr);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&empty_address);
  return;
}

Assistant:

TEST(ElementsConfidentialAddress, EmptyAddressTest) {
  ElementsConfidentialAddress empty_address;
  EXPECT_STREQ("",
               empty_address.GetUnblindedAddress().GetHash().GetHex().c_str());
  EXPECT_STREQ("", empty_address.GetConfidentialKey().GetHex().c_str());

  Address unblind_addr;
  ConfidentialKey key;
  EXPECT_THROW((empty_address = ElementsConfidentialAddress("")), CfdException);
  EXPECT_THROW((empty_address = ElementsConfidentialAddress(unblind_addr, key)),
               CfdException);
}